

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O2

void Js::CacheOperators::CachePropertyReadForGetter
               (PropertyValueInfo *info,Var originalInstance,PropertyId propertyId,
               ScriptContext *requestContext)

{
  ushort uVar1;
  undefined2 uVar2;
  long lVar3;
  Type *type;
  code *pcVar4;
  ushort uVar5;
  bool bVar6;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  DynamicObject *objectWithProperty;
  
  bVar6 = VarIs<Js::RecyclableObject>(originalInstance);
  if (bVar6) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(originalInstance);
    if (pRVar7 != (RecyclableObject *)0x0 && info != (PropertyValueInfo *)0x0) {
      bVar6 = CanCachePropertyRead(info,info->m_instance,requestContext);
      if (bVar6) {
        bVar6 = DynamicType::Is(((info->m_instance->type).ptr)->typeId);
        if (!bVar6) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0x75,"(DynamicType::Is(info->GetInstance()->GetTypeId()))",
                                      "DynamicType::Is(info->GetInstance()->GetTypeId())");
          if (!bVar6) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar8 = 0;
        }
        objectWithProperty = VarTo<Js::DynamicObject,Js::RecyclableObject>(info->m_instance);
        lVar3 = *(long *)((objectWithProperty->super_RecyclableObject).type.ptr + 1);
        uVar2 = info->m_propertyIndex;
        uVar1 = *(ushort *)(lVar3 + 0x12);
        uVar5 = -uVar1;
        if ((ushort)uVar2 < uVar1) {
          uVar5 = *(ushort *)(lVar3 + 10) >> 3;
        }
        type = (pRVar7->type).ptr;
        if ((info->m_instance == (RecyclableObject *)originalInstance) ||
           ((((type->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr ==
            requestContext)) {
          Cache<true,true,false>
                    (info->m_instance != (RecyclableObject *)originalInstance,objectWithProperty,
                     false,type,(Type *)0x0,propertyId,uVar5 + uVar2,(ushort)uVar2 < uVar1,false,0,
                     info,requestContext);
        }
      }
    }
  }
  return;
}

Assistant:

void CacheOperators::CachePropertyReadForGetter(
        PropertyValueInfo *info,
        Var originalInstance,
        PropertyId propertyId,
        ScriptContext* requestContext)
    {
        RecyclableObject* originalObj = JavascriptOperators::TryFromVar<RecyclableObject>(originalInstance);
        if (!info || !originalObj || !CacheOperators::CanCachePropertyRead(info, info->GetInstance(), requestContext))
        {
            return;
        }

        Assert(DynamicType::Is(info->GetInstance()->GetTypeId()));

        DynamicObject * dynamicInstance = VarTo<DynamicObject>(info->GetInstance());
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicInstance->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(info->GetPropertyIndex(), &slotIndex, &isInlineSlot);

        const bool isProto = info->GetInstance() != originalInstance;
        if (isProto && originalObj->GetScriptContext() != requestContext)
        {
            // Don't need to cache if the beginning property is number etc.
            return;
        }

#ifdef TELEMETRY_AddToCache
        if (info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
        {
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(info->GetInstance(), propertyId, nullptr);
            }
        }
#endif


        Cache<true, true, false>(
            isProto,
            dynamicInstance,
            false,
            originalObj->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            false,
            0,
            info,
            requestContext);
    }